

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_helpers.cpp
# Opt level: O3

void duckdb::TestDeleteDirectory(string *path)

{
  char cVar1;
  FileSystem *in_RAX;
  pointer pFVar2;
  pointer *__ptr;
  _Head_base<0UL,_duckdb::FileSystem_*,_false> local_18;
  
  local_18._M_head_impl = in_RAX;
  duckdb::FileSystem::CreateLocal();
  pFVar2 = unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>::operator->
                     ((unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>
                       *)&local_18);
  cVar1 = (**(code **)(*(long *)pFVar2 + 0x68))(pFVar2,path,0);
  if (cVar1 != '\0') {
    pFVar2 = unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>::
             operator->((unique_ptr<duckdb::FileSystem,_std::default_delete<duckdb::FileSystem>,_true>
                         *)&local_18);
    (**(code **)(*(long *)pFVar2 + 0x78))(pFVar2,path,0);
  }
  if (local_18._M_head_impl != (FileSystem *)0x0) {
    (**(code **)(*(long *)local_18._M_head_impl + 8))();
  }
  return;
}

Assistant:

void TestDeleteDirectory(string path) {
	duckdb::unique_ptr<FileSystem> fs = FileSystem::CreateLocal();
	try {
		if (fs->DirectoryExists(path)) {
			fs->RemoveDirectory(path);
		}
	} catch (...) {
	}
}